

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

int __thiscall
CEditor::DoButton_Image
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip,
          bool Used)

{
  void *pvVar1;
  int iVar2;
  char *pText_00;
  long in_FS_OFFSET;
  float extraout_XMM0_Da;
  float fVar3;
  float fVar4;
  undefined8 local_48;
  float fStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (Checked < 0) {
    local_48._0_4_ = 0.0;
    local_48._4_4_ = 0.0;
    fStack_40 = 0.0;
    uStack_3c = 0.5;
  }
  else {
    pvVar1 = (this->m_UI).m_pHotItem;
    if (Checked == 0) {
      if (pvVar1 == pID) {
        uStack_3c = 0.75;
      }
      else {
        uStack_3c = 0.5;
      }
      fStack_40 = 1.0;
      local_48._0_4_ = 1.0;
      local_48._4_4_ = 1.0;
    }
    else {
      if (pvVar1 == pID) {
        uStack_3c = 0.75;
      }
      else {
        uStack_3c = 0.5;
      }
      fStack_40 = 0.0;
      local_48._0_4_ = 1.0;
      local_48._4_4_ = 0.0;
    }
  }
  if (!Used) {
    local_48._4_4_ = local_48._4_4_ * 0.5;
    local_48._0_4_ = local_48._0_4_ * 0.5;
    fStack_40 = fStack_40 * 0.5;
  }
  fVar4 = pRect->w;
  (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
            (0x41200000,this->m_pTextRender,pText,0xffffffff);
  fVar3 = (fVar4 * 8.0) / extraout_XMM0_Da;
  fVar4 = 10.0;
  if (fVar3 <= 10.0) {
    fVar4 = fVar3;
  }
  CUIRect::Draw(pRect,(vec4 *)&local_48,3.0,0xf);
  iVar2 = 5;
  CUI::DoLabel(&this->m_UI,pRect,pText,
               (float)(-(uint)(fVar3 < 6.0) & 0x40c00000 | ~-(uint)(fVar3 < 6.0) & (uint)fVar4),5,
               -1.0,true);
  iVar2 = DoButton_Editor_Common(this,pID,pText_00,iVar2,pRect,Flags,pToolTip);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CEditor::DoButton_Image(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip, bool Used)
{
	// darken the button if not used
	vec4 ButtonColor = GetButtonColor(pID, Checked);
	if(!Used)
		ButtonColor *= vec4(0.5f, 0.5f, 0.5f, 1.0f);

	const float FontSize = clamp(8.0f * pRect->w / TextRender()->TextWidth(10.0f, pText, -1), 6.0f, 10.0f);
	pRect->Draw(ButtonColor, 3.0f);
	UI()->DoLabel(pRect, pText, FontSize, TEXTALIGN_MC);
	return DoButton_Editor_Common(pID, pText, Checked, pRect, Flags, pToolTip);
}